

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderSetIntAttribute(ImfHeader *hdr,char *name,int value)

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<int> *pTVar3;
  int value_local;
  TypedAttribute<int> local_30;
  
  value_local = value;
  IVar1 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_4::TypedAttribute<int>::TypedAttribute(&local_30,&value_local);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_30.super_Attribute);
    Imf_3_4::TypedAttribute<int>::~TypedAttribute(&local_30);
  }
  else {
    pTVar3 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<int>>((Header *)hdr,name);
    pTVar3->_value = value;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetIntAttribute (ImfHeader* hdr, const char name[], int value)
{
    try
    {
        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::IntAttribute (value));
        }
        else
        {
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::IntAttribute> (
                    name)
                .value () = value;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}